

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O3

void __thiscall
diy::ReduceProxy::ReduceProxy
          (ReduceProxy *this,Proxy *proxy,void *block,uint round,Assigner *assigner,
          GIDVector *incoming_gids,GIDVector *outgoing_gids)

{
  pointer *ppBVar1;
  iterator iVar2;
  bool bVar3;
  Master *pMVar4;
  cothread_t pvVar5;
  undefined4 uVar6;
  int iVar7;
  BlockID in_RAX;
  pointer piVar8;
  ulong uVar9;
  ulong uVar10;
  BlockID nbr;
  BlockID local_38;
  
  (this->super_Proxy).iexchange_ = proxy->iexchange_;
  uVar6 = *(undefined4 *)&proxy->field_0x4;
  pMVar4 = proxy->master_;
  (this->super_Proxy).gid_ = proxy->gid_;
  *(undefined4 *)&(this->super_Proxy).field_0x4 = uVar6;
  (this->super_Proxy).master_ = pMVar4;
  local_38 = in_RAX;
  Catch::clara::std::_Rb_tree_header::_Rb_tree_header
            (&(this->super_Proxy).incoming_._M_t._M_impl.super__Rb_tree_header,
             &(proxy->incoming_)._M_t._M_impl.super__Rb_tree_header);
  Catch::clara::std::_Rb_tree_header::_Rb_tree_header
            (&(this->super_Proxy).outgoing_._M_t._M_impl.super__Rb_tree_header,
             &(proxy->outgoing_)._M_t._M_impl.super__Rb_tree_header);
  (this->super_Proxy).done_ = proxy->done_;
  pvVar5 = proxy->main_;
  (this->super_Proxy).collectives_ = proxy->collectives_;
  (this->super_Proxy).main_ = pvVar5;
  this->block_ = block;
  this->round_ = round;
  this->assigner_ = assigner;
  (this->in_link_).super_Factory<diy::Link>._vptr_Factory =
       (_func_int **)&PTR_id_abi_cxx11__001cd7f0;
  (this->in_link_).neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->in_link_).neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->in_link_).neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->out_link_).super_Factory<diy::Link>._vptr_Factory =
       (_func_int **)&PTR_id_abi_cxx11__001cd7f0;
  (this->out_link_).neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->out_link_).neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->out_link_).neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar8 = (incoming_gids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((incoming_gids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
      ._M_finish != piVar8) {
    uVar9 = 0;
    uVar10 = 1;
    do {
      local_38.gid = piVar8[uVar9];
      iVar7 = (*assigner->_vptr_Assigner[3])(assigner);
      local_38.proc = iVar7;
      iVar2._M_current =
           (this->in_link_).neighbors_.
           super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->in_link_).neighbors_.
          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<diy::BlockID,std::allocator<diy::BlockID>>::
        _M_realloc_insert<diy::BlockID_const&>
                  ((vector<diy::BlockID,std::allocator<diy::BlockID>> *)&(this->in_link_).neighbors_
                   ,iVar2,&local_38);
      }
      else {
        *iVar2._M_current = local_38;
        ppBVar1 = &(this->in_link_).neighbors_.
                   super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppBVar1 = *ppBVar1 + 1;
      }
      piVar8 = (incoming_gids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar3 = uVar10 < (ulong)((long)(incoming_gids->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar8 >> 2);
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar3);
  }
  piVar8 = (outgoing_gids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((outgoing_gids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
      ._M_finish != piVar8) {
    uVar9 = 0;
    uVar10 = 1;
    do {
      local_38.gid = piVar8[uVar9];
      iVar7 = (*assigner->_vptr_Assigner[3])(assigner);
      local_38.proc = iVar7;
      iVar2._M_current =
           (this->out_link_).neighbors_.
           super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->out_link_).neighbors_.
          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<diy::BlockID,std::allocator<diy::BlockID>>::
        _M_realloc_insert<diy::BlockID_const&>
                  ((vector<diy::BlockID,std::allocator<diy::BlockID>> *)
                   &(this->out_link_).neighbors_,iVar2,&local_38);
      }
      else {
        *iVar2._M_current = local_38;
        ppBVar1 = &(this->out_link_).neighbors_.
                   super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppBVar1 = *ppBVar1 + 1;
      }
      piVar8 = (outgoing_gids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar3 = uVar10 < (ulong)((long)(outgoing_gids->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar8 >> 2);
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar3);
  }
  return;
}

Assistant:

ReduceProxy(Master::Proxy&&         proxy, //!< parent proxy
                void*                   block, //!< diy block
                unsigned                round, //!< current round
                const Assigner&         assigner, //!< assigner
                const GIDVector&        incoming_gids, //!< incoming gids in this group
                const GIDVector&        outgoing_gids): //!< outgoing gids in this group
      Master::Proxy(std::move(proxy)),
      block_(block),
      round_(round),
      assigner_(assigner)
    {
      // setup in_link
      for (unsigned i = 0; i < incoming_gids.size(); ++i)
      {
        BlockID nbr;
        nbr.gid  = incoming_gids[i];
        nbr.proc = assigner.rank(nbr.gid);
        in_link_.add_neighbor(nbr);
      }

      // setup out_link
      for (unsigned i = 0; i < outgoing_gids.size(); ++i)
      {
        BlockID nbr;
        nbr.gid  = outgoing_gids[i];
        nbr.proc = assigner.rank(nbr.gid);
        out_link_.add_neighbor(nbr);
      }
    }